

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::ParameterDeclarationSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,ParameterDeclarationSyntax *this,size_t index)

{
  Token token;
  SyntaxNode *node;
  SyntaxNode *local_50;
  size_t index_local;
  ParameterDeclarationSyntax *this_local;
  
  if (index == 0) {
    token.kind = (this->super_ParameterDeclarationBaseSyntax).keyword.kind;
    token._2_1_ = (this->super_ParameterDeclarationBaseSyntax).keyword.field_0x2;
    token.numFlags.raw = (this->super_ParameterDeclarationBaseSyntax).keyword.numFlags.raw;
    token.rawLen = (this->super_ParameterDeclarationBaseSyntax).keyword.rawLen;
    token.info = (this->super_ParameterDeclarationBaseSyntax).keyword.info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 1) {
    node = (SyntaxNode *)not_null<slang::syntax::DataTypeSyntax_*>::get(&this->type);
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,node);
  }
  else if (index == 2) {
    local_50 = (SyntaxNode *)0x0;
    if (this != (ParameterDeclarationSyntax *)0xffffffffffffffd8) {
      local_50 = &(this->declarators).super_SyntaxListBase.super_SyntaxNode;
    }
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,local_50);
  }
  else {
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax ParameterDeclarationSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return keyword;
        case 1: return type.get();
        case 2: return &declarators;
        default: return nullptr;
    }
}